

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall
lest::passing::passing(passing *this,location *where_,text *expr_,text *decomposition_,bool zen)

{
  allocator local_17b;
  allocator local_17a;
  allocator local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [32];
  text local_118;
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  text local_b8;
  text local_98;
  location local_78;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,"passed",&local_179);
  std::__cxx11::string::string((string *)&local_98,local_50);
  location::location(&local_78,where_);
  if (zen) {
    std::__cxx11::string::string(local_f8,"",&local_17a);
    std::__cxx11::string::string((string *)&local_178,local_f8);
    std::__cxx11::string::string((string *)&local_158,(string *)&local_178);
  }
  else {
    std::operator+(&local_178," for ",decomposition_);
    std::__cxx11::string::string((string *)&local_158,(string *)&local_178);
  }
  std::operator+(&local_d8,expr_,&local_158);
  std::__cxx11::string::string((string *)&local_b8,(string *)&local_d8);
  std::__cxx11::string::string(local_138,"",&local_17b);
  std::__cxx11::string::string((string *)&local_118,local_138);
  success::success(&this->super_success,&local_98,&local_78,&local_b8,&local_118);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (zen) {
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  *(undefined ***)&(this->super_success).super_message = &PTR__message_00187be0;
  return;
}

Assistant:

passing( location where_, text expr_, text decomposition_, bool zen )
    : success( "passed", where_, expr_ + (zen ? "":" for " + decomposition_) ) {}